

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,XrApplicationInfo *value)

{
  size_t sVar1;
  undefined7 in_register_00000009;
  XrResult XVar2;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_58;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_40;
  
  XVar2 = XR_SUCCESS;
  if ((int)CONCAT71(in_register_00000009,check_members) != 0) {
    sVar1 = strlen(value->applicationName);
    if (sVar1 < 0x81) {
      sVar1 = strlen(value->engineName);
      if (sVar1 < 0x81) {
        return XR_SUCCESS;
      }
      std::__cxx11::string::string
                ((string *)&local_78,"VUID-XrApplicationInfo-engineName-parameter",&local_99);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_58,objects_info);
      std::__cxx11::string::string
                ((string *)&local_98,
                 "Structure XrApplicationInfo member engineName length is too long.",&local_9a);
      CoreValidLogMessage(instance_info,&local_78,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_58,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      this = &local_58;
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_78,"VUID-XrApplicationInfo-applicationName-parameter",&local_99);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_40,objects_info);
      std::__cxx11::string::string
                ((string *)&local_98,
                 "Structure XrApplicationInfo member applicationName length is too long.",&local_9a)
      ;
      CoreValidLogMessage(instance_info,&local_78,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_40,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      this = &local_40;
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_78);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar2;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrApplicationInfo* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    if (XR_MAX_APPLICATION_NAME_SIZE < std::strlen(value->applicationName)) {
        CoreValidLogMessage(instance_info, "VUID-XrApplicationInfo-applicationName-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrApplicationInfo member applicationName length is too long.");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (XR_MAX_ENGINE_NAME_SIZE < std::strlen(value->engineName)) {
        CoreValidLogMessage(instance_info, "VUID-XrApplicationInfo-engineName-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrApplicationInfo member engineName length is too long.");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}